

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_reader.h
# Opt level: O2

void __thiscall
xray_re::xr_reader::
r_seq<std::vector<xray_re::xr_partition*,std::allocator<xray_re::xr_partition*>>,read_partition_v4>
          (xr_reader *this,size_t n,
          vector<xray_re::xr_partition_*,_std::allocator<xray_re::xr_partition_*>_> *container,
          read_partition_v4 read)

{
  bool bVar1;
  xr_partition *local_38;
  read_partition_v4 local_30;
  
  local_30.all_bones = read.all_bones;
  std::vector<xray_re::xr_partition_*,_std::allocator<xray_re::xr_partition_*>_>::reserve
            (container,n);
  while (bVar1 = n != 0, n = n - 1, bVar1) {
    local_38 = (xr_partition *)0x0;
    std::vector<xray_re::xr_partition*,std::allocator<xray_re::xr_partition*>>::
    emplace_back<xray_re::xr_partition*>
              ((vector<xray_re::xr_partition*,std::allocator<xray_re::xr_partition*>> *)container,
               &local_38);
    read_partition_v4::operator()
              (&local_30,
               (container->
               super__Vector_base<xray_re::xr_partition_*,_std::allocator<xray_re::xr_partition_*>_>
               )._M_impl.super__Vector_impl_data._M_finish + -1,this);
  }
  return;
}

Assistant:

inline void xr_reader::r_seq(size_t n, T& container, F read)
{
	container.reserve(n);
	while (n--) {
		container.push_back(typename T::value_type());
		read(container.back(), *this);
	}
}